

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiOldColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  ImGuiOldColumns *pIVar1;
  ImVector<ImGuiOldColumns> *this;
  ImGuiOldColumns *columns;
  ImGuiOldColumns local_a8;
  int local_20;
  ImGuiID local_1c;
  int n;
  ImGuiID id_local;
  ImGuiWindow *window_local;
  
  local_20 = 0;
  local_1c = id;
  _n = window;
  while( true ) {
    if ((_n->ColumnsStorage).Size <= local_20) {
      this = &_n->ColumnsStorage;
      ImGuiOldColumns::ImGuiOldColumns(&local_a8);
      ImVector<ImGuiOldColumns>::push_back(this,&local_a8);
      ImGuiOldColumns::~ImGuiOldColumns(&local_a8);
      pIVar1 = ImVector<ImGuiOldColumns>::back(&_n->ColumnsStorage);
      pIVar1->ID = local_1c;
      return pIVar1;
    }
    pIVar1 = ImVector<ImGuiOldColumns>::operator[](&_n->ColumnsStorage,local_20);
    if (pIVar1->ID == local_1c) break;
    local_20 = local_20 + 1;
  }
  pIVar1 = ImVector<ImGuiOldColumns>::operator[](&_n->ColumnsStorage,local_20);
  return pIVar1;
}

Assistant:

ImGuiOldColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiOldColumns());
    ImGuiOldColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}